

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool S2BooleanOperation::IsEmpty(OpType op_type,S2ShapeIndex *a,S2ShapeIndex *b,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool result_empty;
  S2Error error;
  bool local_b9;
  S2LogMessage local_b8;
  S2Error local_a8;
  S2BooleanOperation local_80;
  
  S2BooleanOperation(&local_80,op_type,&local_b9,options);
  paVar1 = &local_a8.text_.field_2;
  local_a8.code_ = OK;
  local_a8.text_._M_string_length = 0;
  local_a8.text_.field_2._M_local_buf[0] = '\0';
  local_a8.text_._M_dataplus._M_p = (pointer)paVar1;
  Build(&local_80,a,b,&local_a8);
  if (local_a8.code_ == OK) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.text_._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.text_._M_dataplus._M_p);
    }
    std::
    vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
    ::~vector(&local_80.layers_);
    if (local_80.options_.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0
       ) {
      (**(code **)(*(long *)local_80.options_.snap_function_._M_t.
                            super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
                            .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl +
                  8))();
    }
    return local_b9;
  }
  S2LogMessage::S2LogMessage
            (&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x955,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_b8.stream_,"Check failed: error.ok() ",0x19);
  abort();
}

Assistant:

bool S2BooleanOperation::IsEmpty(
    OpType op_type, const S2ShapeIndex& a, const S2ShapeIndex& b,
    const Options& options) {
  bool result_empty;
  S2BooleanOperation op(op_type, &result_empty, options);
  S2Error error;
  op.Build(a, b, &error);
  S2_DCHECK(error.ok());
  return result_empty;
}